

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

bool __thiscall asl::InetAddress::set(InetAddress *this,String *host)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  byte *pbVar4;
  sockaddr_un *a;
  HostPort hp;
  String local_68;
  int local_3c;
  undefined1 local_38 [4];
  int c;
  String thehost;
  String *host_local;
  InetAddress *this_local;
  
  thehost.field_2._8_8_ = host;
  asl::String::String((String *)local_38,host);
  local_3c = asl::String::indexOf((String *)thehost.field_2._8_8_,':',0);
  pcVar3 = asl::String::operator[](thehost.field_2._8_8_,0);
  if (((*pcVar3 != '[') && (-1 < local_3c)) &&
     (iVar2 = asl::String::indexOf((String *)thehost.field_2._8_8_,':',local_3c + 1), 0 < iVar2)) {
    operator+((String *)((long)&hp.port.field_2 + 8),'[',(String *)thehost.field_2._8_8_);
    asl::String::operator+(&local_68,(String *)((long)&hp.port.field_2 + 8),']');
    asl::String::operator=((String *)local_38,&local_68);
    asl::String::~String(&local_68);
    asl::String::~String((String *)((long)&hp.port.field_2 + 8));
  }
  parseHostPort((HostPort *)&a,(String *)local_38);
  bVar1 = asl::String::ok((String *)((long)&hp.host.field_2 + 8));
  if ((bVar1) ||
     ((bVar1 = asl::String::contains((String *)&a,'/'), !bVar1 &&
      (bVar1 = asl::String::contains((String *)&a,'\\'), !bVar1)))) {
    iVar2 = asl::String::operator_cast_to_int((String *)((long)&hp.host.field_2 + 8));
    this_local._7_1_ = set(this,(String *)&a,iVar2);
  }
  else {
    resize(this,0x6e);
    pbVar4 = ptr(this);
    pbVar4[0] = '\x01';
    pbVar4[1] = '\0';
    pcVar3 = asl::String::operator*(thehost.field_2._8_8_);
    iVar2 = asl::String::length((String *)thehost.field_2._8_8_);
    iVar2 = min<int>(0x6c,iVar2 + 1);
    memcpy(pbVar4 + 2,pcVar3,(long)iVar2);
    pbVar4[0x6d] = '\0';
    this->_type = LOCAL;
    this_local._7_1_ = true;
  }
  HostPort::~HostPort((HostPort *)&a);
  asl::String::~String((String *)local_38);
  return this_local._7_1_;
}

Assistant:

bool InetAddress::set(const String& host)
{
	String thehost = host;
	int c = host.indexOf(':');
	if (host[0] != '[' && c >= 0 && host.indexOf(':', c + 1) > 0)
		thehost = '[' + host + ']';

	HostPort hp = parseHostPort(thehost);
	if (!hp.port.ok() && (hp.host.contains('/') || hp.host.contains('\\')))
	{
#ifdef ASL_SOCKET_LOCAL
		resize(sizeof(sockaddr_un));
		sockaddr_un* a=(sockaddr_un*)ptr();
		a->sun_family=AF_UNIX;
		memcpy(a->sun_path, *host, min((int)sizeof(a->sun_path), host.length() + 1));
		a->sun_path[sizeof(a->sun_path) - 1] = '\0';
		_type = LOCAL;
		return true;
#endif
	}
	return set(hp.host, hp.port);
}